

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtParser.c
# Opt level: O0

int nps_yyinput_str(char *buff,int max_size)

{
  int local_18;
  int n;
  int max_size_local;
  char *buff_local;
  
  local_18 = (int)nps_inputdata.limit - (int)nps_inputdata.currp;
  if (max_size < local_18) {
    local_18 = max_size;
  }
  if (0 < local_18) {
    memcpy(buff,nps_inputdata.currp,(long)local_18);
    nps_inputdata.currp = nps_inputdata.currp + local_18;
  }
  return local_18;
}

Assistant:

int nps_yyinput_str(char * buff, int max_size)
{
    int	n;
    
    n = (int)(nps_inputdata.limit - nps_inputdata.currp);
    if (max_size < n) n = max_size;
    
    if (0 < n)
    {
        memcpy(buff, nps_inputdata.currp, n);
        nps_inputdata.currp += n;
    }
    
    return n;
}